

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

void __thiscall Quest_Context::BeginState(Quest_Context *this,string *name,State *state)

{
  int iVar1;
  iterator __position;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  Dialog *pDVar4;
  _Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_> _Var5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  variant *pvVar9;
  _Elt_pointer this_00;
  short sVar10;
  _Elt_pointer pAVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_bool> pVar12;
  string function_name;
  Action action;
  string local_228;
  Dialog *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  _Map_pointer local_1f8;
  _Elt_pointer local_1f0;
  _Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
  *local_1e8;
  _Elt_pointer local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  Action local_1b8;
  
  std::__cxx11::string::_M_assign((string *)&this->state_desc);
  __position._M_node = (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->progress)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var2) {
    do {
      iVar1 = std::__cxx11::string::compare((char *)(__position._M_node + 1));
      if ((iVar1 == 0) ||
         (iVar1 = std::__cxx11::string::compare((char *)(__position._M_node + 1)), iVar1 == 0)) {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        __position = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,short>,std::_Select1st<std::pair<std::__cxx11::string_const,short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                     ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,short>,std::_Select1st<std::pair<std::__cxx11::string_const,short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                                         *)&this->progress,__position);
      }
    } while ((_Rb_tree_header *)__position._M_node != p_Var2);
  }
  local_1e8 = (_Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
               *)&this->dialogs;
  std::
  _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
  ::clear((_Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
           *)local_1e8);
  if ((this->quest->quest->info).disabled == false) {
    pAVar11 = (state->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1e0 = (state->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pAVar11 != local_1e0) {
      local_1f0 = (state->actions).
                  super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last;
      local_1f8 = (state->actions).
                  super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
      p_Var2 = &(this->dialogs)._M_t._M_impl.super__Rb_tree_header;
      do {
        EOPlus::Action::Action(&local_1b8,pAVar11);
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,local_1b8.expr.function._M_dataplus._M_p,
                   local_1b8.expr.function._M_dataplus._M_p +
                   local_1b8.expr.function._M_string_length);
        iVar1 = std::__cxx11::string::compare((char *)local_1d8);
        if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)local_1d8), iVar1 == 0))
        {
          uVar6 = (long)local_1b8.expr.args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur -
                  (long)local_1b8.expr.args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 6;
          if ((long)uVar6 < 0) {
            uVar7 = (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur -
                    (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 9;
LAB_0018447f:
            this_00 = local_1b8.expr.args.
                      super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar7] + uVar6 + uVar7 * -8;
          }
          else {
            this_00 = local_1b8.expr.args.
                      super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            if (7 < uVar6) {
              uVar7 = uVar6 >> 3;
              goto LAB_0018447f;
            }
          }
          iVar1 = util::variant::GetInt(this_00);
          p_Var3 = (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          sVar10 = (short)iVar1;
          _Var5._M_node = &p_Var2->_M_header;
          if (p_Var3 == (_Base_ptr)0x0) {
LAB_001844d7:
            pDVar4 = (Dialog *)operator_new(0x80);
            Dialog::Dialog(pDVar4);
            local_208 = pDVar4;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Dialog*>
                      (&_Stack_200,pDVar4);
            local_228._M_string_length = (size_type)local_208;
            local_228.field_2._M_allocated_capacity = (size_type)_Stack_200._M_pi;
            local_208 = (Dialog *)0x0;
            _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_228._M_dataplus._M_p._0_2_ = sVar10;
            pVar12 = std::
                     _Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
                     ::_M_emplace_unique<std::pair<short,std::shared_ptr<Dialog>>>
                               (local_1e8,(pair<short,_std::shared_ptr<Dialog>_> *)&local_228);
            _Var5 = pVar12.first._M_node;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_228.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_228.field_2._M_allocated_capacity);
            }
            if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
            }
          }
          else {
            do {
              if (sVar10 <= (short)*(size_t *)(p_Var3 + 1)) {
                _Var5._M_node = p_Var3;
              }
              p_Var3 = (&p_Var3->_M_left)[(short)*(size_t *)(p_Var3 + 1) < sVar10];
            } while (p_Var3 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)_Var5._M_node == p_Var2) ||
               (sVar10 < (short)_Var5._M_node[1]._M_color)) goto LAB_001844d7;
          }
          iVar1 = std::__cxx11::string::compare((char *)local_1d8);
          if (iVar1 == 0) {
            lVar8 = (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur -
                    (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6;
            uVar6 = lVar8 + 1;
            if (lVar8 < -1) {
              uVar7 = (long)uVar6 >> 3;
LAB_001845fe:
              pvVar9 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[uVar7] + uVar6 + uVar7 * -8;
            }
            else {
              if (7 < uVar6) {
                uVar7 = uVar6 >> 3;
                goto LAB_001845fe;
              }
              pvVar9 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 1;
            }
            pDVar4 = (Dialog *)_Var5._M_node[1]._M_parent;
            util::variant::GetString_abi_cxx11_(&local_228,pvVar9);
            Dialog::AddPage(pDVar4,&local_228);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_1d8);
            if (iVar1 != 0) goto LAB_001846e3;
            lVar8 = (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur -
                    (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6;
            uVar6 = lVar8 + 1;
            if (lVar8 < -1) {
              uVar7 = (long)uVar6 >> 3;
LAB_00184639:
              pvVar9 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[uVar7] + uVar6 + uVar7 * -8;
            }
            else {
              if (7 < uVar6) {
                uVar7 = uVar6 >> 3;
                goto LAB_00184639;
              }
              pvVar9 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 1;
            }
            pDVar4 = (Dialog *)_Var5._M_node[1]._M_parent;
            iVar1 = util::variant::GetInt(pvVar9);
            lVar8 = (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur -
                    (long)local_1b8.expr.args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6;
            uVar6 = lVar8 + 2;
            if (lVar8 < -2) {
              uVar7 = (long)uVar6 >> 3;
LAB_0018469f:
              pvVar9 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[uVar7] + uVar6 + uVar7 * -8;
            }
            else {
              if (7 < uVar6) {
                uVar7 = uVar6 >> 3;
                goto LAB_0018469f;
              }
              pvVar9 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 2;
            }
            util::variant::GetString_abi_cxx11_(&local_228,pvVar9);
            Dialog::AddLink(pDVar4,iVar1,&local_228);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_228._M_dataplus._M_p._2_6_,(short)local_228._M_dataplus._M_p) !=
              &local_228.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_228._M_dataplus._M_p._2_6_,
                                     (short)local_228._M_dataplus._M_p),
                            (ulong)(local_228.field_2._M_allocated_capacity + 1));
          }
        }
LAB_001846e3:
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
        std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_1b8.expr.args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.expr.function._M_dataplus._M_p != &local_1b8.expr.function.field_2) {
          operator_delete(local_1b8.expr.function._M_dataplus._M_p,
                          local_1b8.expr.function.field_2._M_allocated_capacity + 1);
        }
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(&local_1b8.expr.scopes);
        std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_1b8.cond_expr.args)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.cond_expr.function._M_dataplus._M_p !=
            &local_1b8.cond_expr.function.field_2) {
          operator_delete(local_1b8.cond_expr.function._M_dataplus._M_p,
                          local_1b8.cond_expr.function.field_2._M_allocated_capacity + 1);
        }
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                  (&local_1b8.cond_expr.scopes);
        pAVar11 = pAVar11 + 1;
        if (pAVar11 == local_1f0) {
          pAVar11 = local_1f8[1];
          local_1f8 = local_1f8 + 1;
          local_1f0 = pAVar11 + 1;
        }
      } while (pAVar11 != local_1e0);
    }
  }
  return;
}

Assistant:

void Quest_Context::BeginState(const std::string& name, const EOPlus::State& state)
{
	this->state_desc = state.desc;

	for (auto it = this->progress.begin(); it != this->progress.end(); )
	{
		if (it->first != "d" && it->first != "c")
			it = this->progress.erase(it);
		else
			++it;
	}

	this->dialogs.clear();

	if (this->quest->Disabled())
		return;

	UTIL_FOREACH(state.actions, action)
	{
		std::string function_name = action.expr.function;

		if (function_name == "addnpctext" || function_name == "addnpcinput")
		{
			short vendor_id = int(action.expr.args[0]);
			auto it = this->dialogs.find(vendor_id);

			if (it == this->dialogs.end())
				it = this->dialogs.insert(std::make_pair(vendor_id, std::shared_ptr<Dialog>(new Dialog()))).first;

			if (function_name == "addnpctext")
				it->second->AddPage(std::string(action.expr.args[1]));
			else if (function_name == "addnpcinput")
				it->second->AddLink(int(action.expr.args[1]), std::string(action.expr.args[2]));
		}
	}
}